

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O2

void __thiscall SM83::call_a16<(SM83::Conditions)0>(SM83 *this)

{
  u16 uVar1;
  undefined8 in_RAX;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_const_unsigned_short_&>
  fmt;
  unsigned_short *args_6;
  undefined6 uStack_18;
  u16 address;
  
  args_6 = (unsigned_short *)0x10f1f0;
  _uStack_18 = in_RAX;
  uVar1 = GetWordFromPC(this);
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x4b;
  address = uVar1;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short_const&>
            ((v11 *)"AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  CALL 0x{:04X}\n",
             fmt,&(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,&address,args_6);
  StackPush(this,this->pc);
  this->pc = address;
  Timer::AdvanceCycles(this->timer,4);
  return;
}

Assistant:

void SM83::call_a16() {
    const u16 address = GetWordFromPC();

    if constexpr (cond == Conditions::None) {
        LTRACE("CALL 0x{:04X}", address);
    } else {
        LTRACE("CALL {}, 0x{:04X}", GetConditionString<cond>(), address);
    }

    if (MeetsCondition<cond>()) {
        StackPush(pc);
        pc = address;
        timer.AdvanceCycles(4);
    }
}